

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DwaCompressor::LossyDctEncoderCsc::LossyDctEncoderCsc
          (LossyDctEncoderCsc *this,float quantBaseError,
          vector<const_char_*,_std::allocator<const_char_*>_> *rowPtrsR,
          vector<const_char_*,_std::allocator<const_char_*>_> *rowPtrsG,
          vector<const_char_*,_std::allocator<const_char_*>_> *rowPtrsB,char *packedAc,
          char *packedDc,unsigned_short *toNonlinear,int width,int height,PixelType typeR,
          PixelType typeG,PixelType typeB)

{
  undefined8 *in_RDI;
  int in_stack_000001c8;
  int in_stack_000001cc;
  unsigned_short *in_stack_000001d0;
  char *in_stack_000001d8;
  char *in_stack_000001e0;
  float in_stack_000001ec;
  LossyDctEncoderBase *in_stack_000001f0;
  value_type *in_stack_ffffffffffffffb8;
  vector<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_> *in_stack_ffffffffffffffc0;
  
  LossyDctEncoderBase::LossyDctEncoderBase
            (in_stack_000001f0,in_stack_000001ec,in_stack_000001e0,in_stack_000001d8,
             in_stack_000001d0,in_stack_000001cc,in_stack_000001c8);
  *in_RDI = &PTR__LossyDctEncoderCsc_0040d588;
  std::vector<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>::push_back
            (in_stack_ffffffffffffffc0,(value_type *)in_stack_ffffffffffffffb8);
  std::vector<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>::push_back
            (in_stack_ffffffffffffffc0,(value_type *)in_stack_ffffffffffffffb8);
  std::vector<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>::push_back
            (in_stack_ffffffffffffffc0,(value_type *)in_stack_ffffffffffffffb8);
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::push_back((vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
               *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::push_back((vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
               *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::push_back((vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
               *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

LossyDctEncoderCsc
        (float quantBaseError,
         std::vector<const char *> &rowPtrsR,
         std::vector<const char *> &rowPtrsG,
         std::vector<const char *> &rowPtrsB,
         char *packedAc,
         char *packedDc,
         const unsigned short *toNonlinear,
         int width,
         int height,
         PixelType typeR,
         PixelType typeG,
         PixelType typeB)
    :
        LossyDctEncoderBase
            (quantBaseError, packedAc, packedDc, toNonlinear, width, height)
    {
        _type.push_back(typeR);
        _type.push_back(typeG);
        _type.push_back(typeB);

        _rowPtrs.push_back(rowPtrsR);
        _rowPtrs.push_back(rowPtrsG);
        _rowPtrs.push_back(rowPtrsB);
    }